

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

VdbeCursor * allocateCursor(Vdbe *p,int iCur,int nField,int iDb,u8 eCurType)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  VdbeCursor *pVVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  Mem *pMem;
  
  pMem = p->aMem;
  lVar7 = (long)iCur;
  if (0 < iCur) {
    pMem = pMem + (p->nMem - lVar7);
  }
  lVar1 = (long)nField * 8;
  lVar2 = lVar1 + 0x78;
  iVar6 = (int)lVar2 + 0x128;
  if (eCurType != '\0') {
    iVar6 = (int)lVar2;
  }
  pVVar4 = p->apCsr[lVar7];
  if (pVVar4 != (VdbeCursor *)0x0) {
    if (pVVar4->pBtx == (Btree *)0x0) {
      pVVar4->field_0x5 = pVVar4->field_0x5 & 0xfe;
    }
    sqlite3VdbeFreeCursor(p,p->apCsr[lVar7]);
    p->apCsr[lVar7] = (VdbeCursor *)0x0;
  }
  if (pMem->szMalloc < iVar6) {
    iVar6 = sqlite3VdbeMemGrow(pMem,iVar6,0);
    if (iVar6 != 0) {
      return (VdbeCursor *)0x0;
    }
  }
  else {
    pMem->z = pMem->zMalloc;
    pMem->flags = pMem->flags & 0x2d;
  }
  pVVar4 = (VdbeCursor *)pMem->z;
  p->apCsr[lVar7] = pVVar4;
  pVVar4->eCurType = '\0';
  pVVar4->iDb = '\0';
  pVVar4->nullRow = '\0';
  pVVar4->deferredMoveto = '\0';
  pVVar4->isTable = '\0';
  *(undefined3 *)&pVVar4->field_0x5 = 0;
  pVVar4->pBtx = (Btree *)0x0;
  pVVar4->seqCount = 0;
  pVVar4->aAltMap = (int *)0x0;
  pVVar4->cacheStatus = 0;
  pVVar4->seekResult = 0;
  pVVar4->eCurType = eCurType;
  pVVar4->iDb = (i8)iDb;
  pVVar4->nField = (i16)nField;
  pVVar4->aOffset = pVVar4->aType + nField;
  if (eCurType == '\0') {
    pcVar5 = pMem->z;
    (pVVar4->uc).pCursor = (BtCursor *)(pcVar5 + lVar2);
    pcVar3 = pcVar5 + lVar1 + 0x88;
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\0';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    pcVar5 = pcVar5 + lVar2;
    pcVar5[0] = '\0';
    pcVar5[1] = '\0';
    pcVar5[2] = '\0';
    pcVar5[3] = '\0';
    pcVar5[4] = '\0';
    pcVar5[5] = '\0';
    pcVar5[6] = '\0';
    pcVar5[7] = '\0';
    pcVar5[8] = '\0';
    pcVar5[9] = '\0';
    pcVar5[10] = '\0';
    pcVar5[0xb] = '\0';
    pcVar5[0xc] = '\0';
    pcVar5[0xd] = '\0';
    pcVar5[0xe] = '\0';
    pcVar5[0xf] = '\0';
  }
  return pVVar4;
}

Assistant:

static VdbeCursor *allocateCursor(
  Vdbe *p,              /* The virtual machine */
  int iCur,             /* Index of the new VdbeCursor */
  int nField,           /* Number of fields in the table or index */
  int iDb,              /* Database the cursor belongs to, or -1 */
  u8 eCurType           /* Type of the new cursor */
){
  /* Find the memory cell that will be used to store the blob of memory
  ** required for this VdbeCursor structure. It is convenient to use a 
  ** vdbe memory cell to manage the memory allocation required for a
  ** VdbeCursor structure for the following reasons:
  **
  **   * Sometimes cursor numbers are used for a couple of different
  **     purposes in a vdbe program. The different uses might require
  **     different sized allocations. Memory cells provide growable
  **     allocations.
  **
  **   * When using ENABLE_MEMORY_MANAGEMENT, memory cell buffers can
  **     be freed lazily via the sqlite3_release_memory() API. This
  **     minimizes the number of malloc calls made by the system.
  **
  ** The memory cell for cursor 0 is aMem[0]. The rest are allocated from
  ** the top of the register space.  Cursor 1 is at Mem[p->nMem-1].
  ** Cursor 2 is at Mem[p->nMem-2]. And so forth.
  */
  Mem *pMem = iCur>0 ? &p->aMem[p->nMem-iCur] : p->aMem;

  int nByte;
  VdbeCursor *pCx = 0;
  nByte = 
      ROUND8(sizeof(VdbeCursor)) + 2*sizeof(u32)*nField + 
      (eCurType==CURTYPE_BTREE?sqlite3BtreeCursorSize():0);

  assert( iCur>=0 && iCur<p->nCursor );
  if( p->apCsr[iCur] ){ /*OPTIMIZATION-IF-FALSE*/
    /* Before calling sqlite3VdbeFreeCursor(), ensure the isEphemeral flag
    ** is clear. Otherwise, if this is an ephemeral cursor created by 
    ** OP_OpenDup, the cursor will not be closed and will still be part
    ** of a BtShared.pCursor list.  */
    if( p->apCsr[iCur]->pBtx==0 ) p->apCsr[iCur]->isEphemeral = 0;
    sqlite3VdbeFreeCursor(p, p->apCsr[iCur]);
    p->apCsr[iCur] = 0;
  }
  if( SQLITE_OK==sqlite3VdbeMemClearAndResize(pMem, nByte) ){
    p->apCsr[iCur] = pCx = (VdbeCursor*)pMem->z;
    memset(pCx, 0, offsetof(VdbeCursor,pAltCursor));
    pCx->eCurType = eCurType;
    pCx->iDb = iDb;
    pCx->nField = nField;
    pCx->aOffset = &pCx->aType[nField];
    if( eCurType==CURTYPE_BTREE ){
      pCx->uc.pCursor = (BtCursor*)
          &pMem->z[ROUND8(sizeof(VdbeCursor))+2*sizeof(u32)*nField];
      sqlite3BtreeCursorZero(pCx->uc.pCursor);
    }
  }
  return pCx;
}